

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O2

ThreadLog * __thiscall deqp::egl::ThreadLog::operator<<(ThreadLog *this,EndMessageToken *param_1)

{
  deUint64 timeUs_;
  undefined1 auStack_68 [40];
  char *local_40 [4];
  
  timeUs_ = deGetMicroseconds();
  std::__cxx11::stringbuf::str();
  Message::Message((Message *)auStack_68,timeUs_,local_40[0]);
  std::vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>::
  emplace_back<deqp::egl::ThreadLog::Message>(&this->m_messages,(Message *)auStack_68);
  std::__cxx11::string::~string((string *)(auStack_68 + 8));
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_68,"",(allocator<char> *)local_40);
  std::__cxx11::stringbuf::str((string *)&this->field_0x8);
  std::__cxx11::string::~string((string *)auStack_68);
  return this;
}

Assistant:

ThreadLog& ThreadLog::operator<< (const EndMessageToken&)
{
	m_messages.push_back(Message(deGetMicroseconds(), m_message.str().c_str()));
	m_message.str("");
	return *this;
}